

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O1

void __thiscall sf2cute::SoundFont::~SoundFont(SoundFont *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  pcVar2 = (this->software_)._M_dataplus._M_p;
  paVar1 = &(this->software_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->comment_)._M_dataplus._M_p;
  paVar1 = &(this->comment_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->copyright_)._M_dataplus._M_p;
  paVar1 = &(this->copyright_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->product_)._M_dataplus._M_p;
  paVar1 = &(this->product_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->engineers_)._M_dataplus._M_p;
  paVar1 = &(this->engineers_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->creation_date_)._M_dataplus._M_p;
  paVar1 = &(this->creation_date_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->rom_name_)._M_dataplus._M_p;
  paVar1 = &(this->rom_name_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->bank_name_)._M_dataplus._M_p;
  paVar1 = &(this->bank_name_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->sound_engine_)._M_dataplus._M_p;
  paVar1 = &(this->sound_engine_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::
  vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>::
  ~vector(&this->samples_);
  std::
  vector<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>
  ::~vector(&this->instruments_);
  std::
  vector<std::shared_ptr<sf2cute::SFPreset>,_std::allocator<std::shared_ptr<sf2cute::SFPreset>_>_>::
  ~vector(&this->presets_);
  return;
}

Assistant:

~SoundFont() = default;